

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall
boost::runtime::unrecognized_param::unrecognized_param
          (unrecognized_param *this,unrecognized_param *param_2)

{
  specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error> *in_RDI;
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  *in_stack_00000028;
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  *in_stack_00000030;
  specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>
  *in_stack_ffffffffffffffe0;
  
  specific_param_error<boost::runtime::unrecognized_param,_boost::runtime::input_error>::
  specific_param_error(in_stack_ffffffffffffffe0,in_RDI);
  *(undefined ***)&(in_RDI->super_input_error).super_param_error = &PTR__unrecognized_param_00303c58
  ;
  std::
  vector<boost::unit_test::basic_cstring<const_char>,_std::allocator<boost::unit_test::basic_cstring<const_char>_>_>
  ::vector(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

explicit    unrecognized_param( std::vector<cstring>&& type_candidates )
    : specific_param_error<unrecognized_param,input_error>( "" )
    , m_typo_candidates( std::move( type_candidates ) ) {}